

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleGenerator.h
# Opt level: O0

void __thiscall RuleGenerator::RuleGenerator(RuleGenerator *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_126;
  key_equal local_125;
  hasher local_124;
  undefined1 local_123;
  allocator local_122;
  allocator local_121;
  allocator local_120;
  allocator local_11f;
  allocator local_11e;
  allocator local_11d [20];
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  RuleGenerator *this_local;
  
  this->_vptr_RuleGenerator = (_func_int **)&PTR___cxa_pure_virtual_00193a40;
  local_10 = (undefined1  [8])this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->cells);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->tokens);
  std::
  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  ::vector(&this->token_maps);
  local_123 = 1;
  local_108 = &local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"the",&local_109);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"for",local_11d);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"to",&local_11e);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"in",&local_11f);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"and",&local_120);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"of",&local_121);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"on",&local_122);
  local_123 = 0;
  local_20 = &local_100;
  local_18 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_126);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->stop_words,__l,0,&local_124,&local_125,&local_126);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_126);
  local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_1d0 = local_1d0 + -1;
    std::__cxx11::string::~string((string *)local_1d0);
  } while (local_1d0 != &local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_122);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e);
  std::allocator<char>::~allocator((allocator<char> *)local_11d);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  return;
}

Assistant:

RuleGenerator() {}